

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IStream * Catch::makeStream(StringRef *filename)

{
  size_type sVar1;
  int *piVar2;
  IStream *pIVar3;
  streambuf *psVar4;
  char *pcVar5;
  IStream *this;
  string local_70;
  ReusableStringStream local_50;
  StringRef local_38;
  
  sVar1 = filename->m_size;
  if (sVar1 == 0) {
    pIVar3 = (IStream *)operator_new(0x118);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__CoutStream_001cde28;
    std::ostream::ostream(pIVar3 + 1,*(streambuf **)(__cxa_throw + *(long *)(std::cout + -0x18)));
  }
  else {
    piVar2 = (int *)filename->m_start;
    if ((char)*piVar2 == '%') {
      if ((sVar1 != 6) || ((short)piVar2[1] != 0x6775 || *piVar2 != 0x62656425)) {
        ReusableStringStream::ReusableStringStream(&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_50.m_oss,"Unrecognised stream: \'",0x16);
        std::ostream::write((char *)local_50.m_oss,(long)filename->m_start);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_50.m_oss,"\'",1);
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_70);
      }
      pIVar3 = (IStream *)operator_new(0x120);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_001cde68;
      psVar4 = (streambuf *)operator_new(0x148);
      *(code **)psVar4 = sysconf;
      *(undefined8 *)(psVar4 + 8) = 0;
      *(undefined8 *)(psVar4 + 0x10) = 0;
      *(undefined8 *)(psVar4 + 0x18) = 0;
      *(undefined8 *)(psVar4 + 0x20) = 0;
      *(undefined8 *)(psVar4 + 0x28) = 0;
      *(undefined8 *)(psVar4 + 0x30) = 0;
      std::locale::locale((locale *)(psVar4 + 0x38));
      *(undefined ***)psVar4 = &PTR__StreamBufImpl_001cdea8;
      *(streambuf **)(psVar4 + 0x28) = psVar4 + 0x40;
      *(streambuf **)(psVar4 + 0x20) = psVar4 + 0x40;
      *(streambuf **)(psVar4 + 0x30) = psVar4 + 0x140;
      pIVar3[1]._vptr_IStream = (_func_int **)psVar4;
      std::ostream::ostream(pIVar3 + 2,psVar4);
    }
    else {
      pIVar3 = (IStream *)operator_new(0x208);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__FileStream_001cdf40;
      this = pIVar3 + 1;
      local_38.m_start = (char *)piVar2;
      local_38.m_size = sVar1;
      std::ofstream::ofstream(this);
      pcVar5 = StringRef::c_str(&local_38);
      std::ofstream::open((char *)this,(_Ios_Openmode)pcVar5);
      if (((byte)this->_vptr_IStream[-3][(long)&pIVar3[5]._vptr_IStream] & 5) != 0) {
        ReusableStringStream::ReusableStringStream(&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_50.m_oss,"Unable to open file: \'",0x16);
        std::ostream::write((char *)local_50.m_oss,(long)piVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_50.m_oss,"\'",1);
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_70);
      }
    }
  }
  return pIVar3;
}

Assistant:

constexpr auto size() const noexcept -> size_type {
            return m_size;
        }